

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sjio.cpp
# Opt level: O1

void WriteBreakpoint(aint val)

{
  char *__format;
  
  if (FP_BreakpointsFile == (FILE *)0x0) {
    WarningById(W_BP_FILE,(char *)0x0,W_PASS3);
    return;
  }
  breakpointsCounter = breakpointsCounter + 1;
  check16u(val);
  if (breakpointsType == BPSF_MAME) {
    __format = "bp 0x%04X\n";
  }
  else {
    if (breakpointsType == BPSF_ZESARUX) {
      if (breakpointsCounter == 1) {
        fputs(" --enable-breakpoints ",(FILE *)FP_BreakpointsFile);
      }
      if (100 < breakpointsCounter) {
        Warning("Maximum amount of 100 breakpoints has been already reached, this one is ignored",
                (char *)0x0,W_PASS3);
        return;
      }
      fprintf((FILE *)FP_BreakpointsFile,"--set-breakpoint %d \"PC=%d\" ",
              (ulong)(uint)breakpointsCounter,(ulong)(uint)val & 0xffff);
      return;
    }
    if (breakpointsType != BPSF_UNREAL) {
      return;
    }
    __format = "x0=0x%04X\n";
  }
  fprintf((FILE *)FP_BreakpointsFile,__format,(ulong)(uint)val & 0xffff);
  return;
}

Assistant:

void WriteBreakpoint(const aint val) {
	if (!FP_BreakpointsFile) {
		WarningById(W_BP_FILE);
		return;
	}
	++breakpointsCounter;
	check16u(val);
	switch (breakpointsType) {
		case BPSF_UNREAL:
			fprintf(FP_BreakpointsFile, "x0=0x%04X\n", val&0xFFFF);
			break;
		case BPSF_MAME:		// technically "0x" can be omitted for MAME, but it also shouldn't hurt
			fprintf(FP_BreakpointsFile, "bp 0x%04X\n", val&0xFFFF);
			break;
		case BPSF_ZESARUX:
			if (1 == breakpointsCounter) fputs(" --enable-breakpoints ", FP_BreakpointsFile);
			if (100 < breakpointsCounter) {
				Warning("Maximum amount of 100 breakpoints has been already reached, this one is ignored");
				break;
			}
			fprintf(FP_BreakpointsFile, "--set-breakpoint %d \"PC=%d\" ", breakpointsCounter, val&0xFFFF);
			break;
	}
}